

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O1

void __thiscall github111116::ConsoleLogger::log<char[24]>(ConsoleLogger *this,char (*args) [24])

{
  int iVar1;
  
  if (0 < this->loglevel) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"    ",4);
    print<char[24]>(this,args);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}